

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colony.cpp
# Opt level: O2

void __thiscall Colony::move_ants(Colony *this)

{
  value_type_conflict2 *__x;
  bool *pbVar1;
  int *piVar2;
  double dVar3;
  Node *pNVar4;
  Car *pCVar5;
  double dVar6;
  Node a;
  double dVar7;
  pointer ppVar8;
  pointer pdVar9;
  bool bVar10;
  long lVar11;
  ulong uVar12;
  ostream *poVar13;
  int x;
  int iVar14;
  int iVar15;
  long lVar16;
  Colony *pCVar17;
  long lVar18;
  long lVar19;
  pointer ppVar20;
  double *pdVar21;
  long lVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  double dVar25;
  int local_11c;
  double local_118;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> feasible_edges;
  double up;
  int local_dc;
  vector<double,_std::allocator<double>_> ups;
  vector<double,_std::allocator<double>_> probs;
  vector<double,_std::allocator<double>_> cumulative_sum;
  
  iVar15 = 0;
  do {
    bVar10 = Graph::is_all_visited(&this->super_Graph);
    if (bVar10) break;
    pCVar17 = (Colony *)(this->super_Graph).cars;
    lVar11 = (long)iVar15;
    lVar18 = lVar11 * 0x30;
    if (*(long *)((long)&pCVar17->super_Graph + lVar18 + 0x18) ==
        *(long *)((long)&pCVar17->super_Graph + lVar18 + 0x20)) {
      pCVar17 = (Colony *)((long)&pCVar17->super_Graph + lVar18);
      Car::add_node((Car *)pCVar17,(this->super_Graph).nodes,(this->super_Graph).distance_matrix);
    }
    feasible_edges.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    feasible_edges.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    feasible_edges.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    while (feasible_edges.
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start ==
           feasible_edges.
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_finish) {
      pCVar17 = (Colony *)(this->super_Graph).cars;
      if (0x4b0 < *(int *)((long)&pCVar17->super_Graph + lVar18 + 0x10)) {
        iVar14 = iVar15 + 1;
        if (iVar14 < (this->super_Graph).num_car) {
          bVar10 = true;
          iVar15 = iVar14;
          if (*(int *)((long)&pCVar17->super_Graph + lVar18 + 8) != 0) {
            Car::add_node((Car *)((long)&pCVar17->super_Graph + lVar18),(this->super_Graph).nodes,
                          (this->super_Graph).distance_matrix);
          }
        }
        else {
          poVar13 = std::operator<<((ostream *)&std::cout,"cannot visit all customers this step.");
          std::endl<char,std::char_traits<char>>(poVar13);
          bVar10 = false;
        }
        goto LAB_00104dc9;
      }
      lVar16 = 0x100000000;
      lVar19 = 0;
      for (lVar22 = 1; lVar22 < (this->super_Graph).num_node; lVar22 = lVar22 + 1) {
        pNVar4 = (this->super_Graph).nodes;
        if ((&pNVar4[1].visited)[lVar19] == false) {
          pCVar17 = (Colony *)((this->super_Graph).cars + lVar11);
          bVar10 = Car::ok_capacity((Car *)pCVar17,*(Node *)((long)&pNVar4[1].x + lVar19));
          if (bVar10) {
            pCVar17 = (Colony *)((this->super_Graph).cars + lVar11);
            pNVar4 = (this->super_Graph).nodes;
            pbVar1 = &pNVar4[1].visited + lVar19;
            a._16_8_ = *(undefined8 *)pbVar1;
            a._0_16_ = *(undefined1 (*) [16])((long)&pNVar4[1].x + lVar19);
            a._24_8_ = *(undefined8 *)(pbVar1 + 8);
            bVar10 = Car::ok_time((Car *)pCVar17,a,(this->super_Graph).distance_matrix);
            if (bVar10) {
              ups.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)((ulong)(uint)(this->super_Graph).cars[lVar11].now_idx + lVar16);
              pCVar17 = (Colony *)&feasible_edges;
              std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
              emplace_back<std::pair<int,int>>
                        ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)pCVar17,
                         (pair<int,_int> *)&ups);
            }
          }
        }
        lVar19 = lVar19 + 0x20;
        lVar16 = lVar16 + 0x100000000;
      }
      if (feasible_edges.
          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
          super__Vector_impl_data._M_start ==
          feasible_edges.
          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        piVar2 = &(this->super_Graph).cars[lVar11].now_time;
        *piVar2 = *piVar2 + 0x1e;
      }
    }
    dVar25 = get_rand(pCVar17);
    ppVar8 = feasible_edges.
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (threshold <= dVar25) {
      ups.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      ups.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      ups.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      cumulative_sum.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      cumulative_sum.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      cumulative_sum.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_118 = 0.0;
      for (ppVar20 = feasible_edges.
                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          pdVar9 = ups.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish,
          pdVar21 = ups.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start, ppVar20 != ppVar8; ppVar20 = ppVar20 + 1) {
        dVar25 = calc_prob(this,ppVar20->first,ppVar20->second);
        up = dVar25;
        std::vector<double,_std::allocator<double>_>::push_back(&ups,&up);
        local_118 = local_118 + dVar25;
      }
      for (; pdVar21 != pdVar9; pdVar21 = pdVar21 + 1) {
        up = *pdVar21 / local_118;
        std::vector<double,_std::allocator<double>_>::emplace_back<double>(&probs,&up);
      }
      pCVar17 = (Colony *)&cumulative_sum;
      std::vector<double,_std::allocator<double>_>::push_back
                (&cumulative_sum,
                 probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start);
      lVar18 = 8;
      for (uVar12 = 0; dVar25 = INFIN,
          uVar12 < ((long)probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start >> 3) - 1U; uVar12 = uVar12 + 1) {
        __x = (value_type_conflict2 *)
              ((long)probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start + lVar18);
        probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar12 + 1] =
             probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar12] +
             probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar12 + 1];
        lVar18 = lVar18 + 8;
        pCVar17 = (Colony *)&cumulative_sum;
        std::vector<double,_std::allocator<double>_>::push_back(&cumulative_sum,__x);
      }
      dVar6 = get_rand(pCVar17);
      dVar7 = INFIN;
      for (lVar18 = 0;
          (long)cumulative_sum.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)cumulative_sum.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start >> 3 != lVar18; lVar18 = lVar18 + 1) {
        dVar3 = cumulative_sum.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar18];
        uVar23 = SUB84(dVar3,0);
        uVar24 = (undefined4)((ulong)dVar3 >> 0x20);
        iVar14 = (int)lVar18;
        if (dVar3 < dVar6 || dVar25 <= dVar3) {
          uVar23 = SUB84(dVar25,0);
          uVar24 = (undefined4)((ulong)dVar25 >> 0x20);
          iVar14 = local_dc;
        }
        local_dc = iVar14;
        dVar25 = (double)CONCAT44(uVar24,uVar23);
      }
      iVar14 = 3;
      if ((dVar25 != INFIN) || (NAN(dVar25) || NAN(INFIN))) {
        local_11c = feasible_edges.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start[local_dc].second;
        iVar14 = 0;
      }
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&cumulative_sum.super__Vector_base<double,_std::allocator<double>_>);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&probs.super__Vector_base<double,_std::allocator<double>_>);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&ups.super__Vector_base<double,_std::allocator<double>_>);
      if ((dVar25 != dVar7) || (NAN(dVar25) || NAN(dVar7))) goto LAB_00104d7d;
    }
    else {
      iVar14 = rand();
      local_11c = feasible_edges.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_start
                  [(ulong)(long)iVar14 %
                   (ulong)((long)feasible_edges.
                                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)feasible_edges.
                                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3)].second;
LAB_00104d7d:
      iVar14 = 0;
      Car::add_node((this->super_Graph).cars + lVar11,(this->super_Graph).nodes + local_11c,
                    (this->super_Graph).distance_matrix);
    }
    bVar10 = iVar14 == 0;
LAB_00104dc9:
    std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
              (&feasible_edges.
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>);
  } while (bVar10);
  pCVar5 = (this->super_Graph).cars;
  if (pCVar5[iVar15].now_idx != 0) {
    Car::add_node(pCVar5 + iVar15,(this->super_Graph).nodes,(this->super_Graph).distance_matrix);
  }
  return;
}

Assistant:

void Colony::move_ants()
{
	int car_idx = 0;
	while(!is_all_visited()){
		if(cars[car_idx].tour.empty()){
			cars[car_idx].add_node(&nodes[0], distance_matrix);// nodes[0] denotes depot
		}
		std::vector< std::pair<int, int> > feasible_edges;
		feasible_edges.clear();
		while (feasible_edges.empty() && cars[car_idx].now_time <= 1200){
			for(int node_idx = 1; node_idx < num_node; node_idx++){
				if(!nodes[node_idx].visited){
					if(cars[car_idx].ok_capacity(nodes[node_idx])){
						if(cars[car_idx].ok_time(nodes[node_idx], distance_matrix)){
							feasible_edges.push_back(std::make_pair(cars[car_idx].now_idx, node_idx));
						}
					}
				}
			}
			if(feasible_edges.empty()){
				cars[car_idx].now_time += 30;// wait for the tw_open at the depot
			}
		}
		
		if(feasible_edges.empty()){// if still edges are not found, return depot
			if(car_idx + 1 < num_car){// check if the rest of vehicles exists
				if(cars[car_idx].now_idx != 0){// in case the vehicle did not return back to the depot
					cars[car_idx].add_node(&nodes[0], distance_matrix);
				}
				car_idx += 1;// assign next vehicle			
			}
			else{
				std::cout << "cannot visit all customers this step." << std::endl;
				break;
			}
		}
		else{
			int next_node_idx;
			if (get_rand() < threshold){// choose randomly next node, this prevents local optimization
				next_node_idx = feasible_edges[rand() % feasible_edges.size()].second;
			}
			else{// follow heuristc and pheromone formula, choose next node
				std::vector<double> ups, probs, cumulative_sum;
				double sum = 0.0;
				for (auto feasible_edge : feasible_edges){
					double up = calc_prob(feasible_edge.first, feasible_edge.second);
					sum += up;
					ups.push_back(up);
				}
				for (auto up : ups){
					probs.push_back(up / sum);
				}
				cumulative_sum.push_back(probs.front());
				for (int i = 0; i < probs.size() - 1; i ++){
					probs[i+1] += probs[i];
					cumulative_sum.push_back(probs[i+1]);
				}
				int candi_idx, best_idx;
				double candi_v;
				double best_v = INFIN;
				double r = get_rand();
				for (int x = 0; x < cumulative_sum.size(); x++){
					if (r <= cumulative_sum[x]){
						candi_idx = x;
						candi_v = cumulative_sum[x];
						if (candi_v < best_v){
							best_idx = candi_idx;
							best_v = candi_v;
						}
					}
				}
				if (best_v == INFIN){
						break;
				}
				next_node_idx = feasible_edges[best_idx].second;
				
				// search algorithm
				// double rand = get_rand();
				// // std::sort(cumulative_sum.begin(), cumulative_sum.end());
				// for (auto itr = cumulative_sum.begin(); itr != cumulative_sum.end(); itr++){
				// 	if (rand_num < *itr){
				// 		int next_node_idx = itr;
				// 		break;
				// 	}
				// }
				// auto iter = std::max_element(cumulative_sum.begin(), cumulative_sum.end());
				// next_node_idx = std::distance(cumulative_sum.begin(), iter);// https://teramonagi.hatenablog.com/entry/20130225/1361793892
			}
			cars[car_idx].add_node(&nodes[next_node_idx], distance_matrix);
		}
	}// while loop done
	if(cars[car_idx].now_idx != 0){// in case the vehicle did not return back to the depot
		cars[car_idx].add_node(&nodes[0], distance_matrix);
	}
}